

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_prompt.hpp
# Opt level: O2

string * util::prompt(string *__return_storage_ptr__,string *__question,int __max_size)

{
  int iVar1;
  ostream *poVar2;
  allocator local_31;
  
  if (__max_size < 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    do {
      std::ostream::flush();
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)__question);
      std::operator<<(poVar2,"\n>>> ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)__return_storage_ptr__);
      iVar1 = (int)__return_storage_ptr__->_M_string_length;
    } while (__max_size < iVar1 || iVar1 < 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prompt(std::string __question, int __max_size = MAX_STRING_LENGTH)
	{
		if (__max_size <= 0)
			return "";

		std::string _out;
		int _out_length;
		do {
			std::cout.flush();
			std::cout << __question << "\n>>> ";
			std::getline(std::cin, _out);
			_out_length = _out.length();
		} while (_out_length <= 0 || _out_length > __max_size);

		return _out;
	}